

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstWalker.cpp
# Opt level: O0

void __thiscall AstWalker::visitIfStatementAstNode(AstWalker *this,IfStatementAstNode *node)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  __shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2> *this_00;
  IfStatementAstNode *node_local;
  AstWalker *this_local;
  
  (*this->_vptr_AstWalker[0x16])(this,node);
  peVar2 = std::__shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(node->expression).
                       super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>);
  (*this->_vptr_AstWalker[3])(this,peVar2);
  peVar3 = std::__shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(node->ifStatement).
                       super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>);
  (*this->_vptr_AstWalker[2])(this,peVar3);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&node->elseStatement);
  if (bVar1) {
    this_00 = &std::optional<std::shared_ptr<StatementAstNode>_>::operator->(&node->elseStatement)->
               super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>;
    peVar3 = std::__shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
    (*this->_vptr_AstWalker[2])(this,peVar3);
  }
  (*this->_vptr_AstWalker[0x25])(this,node);
  return;
}

Assistant:

void AstWalker::visitIfStatementAstNode(IfStatementAstNode* node) noexcept {
  this->onEnterIfStatementAstNode(node);
  this->visitExpressionAstNode(node->expression.get());
  this->visitStatementAstNode(node->ifStatement.get());
  if (node->elseStatement) {
    this->visitStatementAstNode(node->elseStatement->get());
  }
  this->onExitIfStatementAstNode(node);
}